

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void secp256k1_memczero(void *s,size_t len,int flag)

{
  uchar mask;
  byte *pbStack_28;
  int vflag;
  uchar *p;
  size_t sStack_18;
  int flag_local;
  size_t len_local;
  void *s_local;
  
  pbStack_28 = (byte *)s;
  for (sStack_18 = len; sStack_18 != 0; sStack_18 = sStack_18 - 1) {
    *pbStack_28 = *pbStack_28 & (-(char)flag ^ 0xffU);
    pbStack_28 = pbStack_28 + 1;
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_memczero(void *s, size_t len, int flag) {
    unsigned char *p = (unsigned char *)s;
    /* Access flag with a volatile-qualified lvalue.
       This prevents clang from figuring out (after inlining) that flag can
       take only be 0 or 1, which leads to variable time code. */
    volatile int vflag = flag;
    unsigned char mask = -(unsigned char) vflag;
    while (len) {
        *p &= ~mask;
        p++;
        len--;
    }
}